

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

int mem_has_null(void *block,uint size)

{
  uint i;
  uchar *bytes;
  uint size_local;
  void *block_local;
  
  i = 0;
  while( true ) {
    if (size <= i) {
      return 0;
    }
    if (*(char *)((long)block + (ulong)i) == '\0') break;
    i = i + 1;
  }
  return 1;
}

Assistant:

int mem_has_null(const void *block, unsigned size)
{
	const unsigned char *bytes = block;
	unsigned i;        
	for(i = 0; i < size; i++)
	{
		if(bytes[i] == 0)
		{
			return 1;
		}
	}
	return 0;
}